

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p3ch18ex9.cpp
# Opt level: O3

void func_arr(void)

{
  int *piVar1;
  void *pvVar2;
  long lVar3;
  ostream *poVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  
  pvVar2 = operator_new__(400);
  iVar6 = 0;
  iVar7 = 1;
  iVar8 = 2;
  iVar9 = 3;
  lVar3 = 0;
  do {
    piVar1 = (int *)((long)pvVar2 + lVar3 * 4);
    *piVar1 = iVar6;
    piVar1[1] = iVar7;
    piVar1[2] = iVar8;
    piVar1[3] = iVar9;
    lVar3 = lVar3 + 4;
    iVar6 = iVar6 + 4;
    iVar7 = iVar7 + 4;
    iVar8 = iVar8 + 4;
    iVar9 = iVar9 + 4;
  } while (lVar3 != 100);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nMemory addresses in array:",0x1b);
  uVar5 = 0xfffffffffffffff6;
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n&arr[",6);
    uVar5 = uVar5 + 10;
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] = ",4);
    std::ostream::_M_insert<void_const*>(poVar4);
  } while (uVar5 < 0x5a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  operator_delete__(pvVar2);
  return;
}

Assistant:

void func_arr()
{
	constexpr unsigned int size = 100;
	int* arr = new int[size];
	for (int i = 0; i < size; i++)
	{
		arr[i] = i;
	}
	std::cout << "\nMemory addresses in array:";
	for (int i = 0; i < size; i += 10)
	{
		std::cout << "\n&arr[" << i << "] = " << &arr[i];
	}
	std::cout << std::endl;
	delete[] arr;
}